

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
fasttext::FastText::selectEmbeddings
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,FastText *this,int32_t cutoff)

{
  element_type *peVar1;
  pointer piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int32_t iVar7;
  DenseMatrix *pDVar8;
  int64_t m;
  size_type __n;
  pointer piVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  DenseMatrix *pDVar14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  int iVar16;
  undefined1 auVar15 [16];
  int iVar17;
  int iVar20;
  undefined1 auVar19 [16];
  string_view w;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_olegtarasov[P]fastText_src_fasttext_cc:313:37)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_olegtarasov[P]fastText_src_fasttext_cc:313:37)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_olegtarasov[P]fastText_src_fasttext_cc:313:37)>
  __comp_01;
  Vector norms;
  allocator_type local_51;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  Vector local_48;
  value_type_conflict1 local_34;
  undefined1 auVar18 [16];
  
  peVar1 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pDVar14 = (DenseMatrix *)0x0;
  }
  else {
    p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pDVar8 = (DenseMatrix *)__dynamic_cast(peVar1,&Matrix::typeinfo,&DenseMatrix::typeinfo,0);
    pDVar14 = (DenseMatrix *)0x0;
    if (pDVar8 != (DenseMatrix *)0x0) {
      p_Var13 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      pDVar14 = pDVar8;
      if (p_Var13 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
      }
    }
  }
  local_50 = p_Var13;
  m = Matrix::size(&pDVar14->super_Matrix,0);
  Vector::Vector(&local_48,m);
  DenseMatrix::l2NormRow(pDVar14,&local_48);
  __n = Matrix::size(&pDVar14->super_Matrix,0);
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__n,&local_34,&local_51);
  auVar6 = _DAT_001468b0;
  auVar5 = _DAT_001468a0;
  auVar4 = _DAT_001461a0;
  piVar9 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar9 != piVar2) {
    uVar10 = (long)piVar2 + (-4 - (long)piVar9);
    auVar19._8_4_ = (int)uVar10;
    auVar19._0_8_ = uVar10;
    auVar19._12_4_ = (int)(uVar10 >> 0x20);
    auVar15._0_8_ = uVar10 >> 2;
    auVar15._8_8_ = auVar19._8_8_ >> 2;
    uVar11 = 0;
    auVar15 = auVar15 ^ _DAT_001461a0;
    do {
      iVar17 = (int)uVar11;
      auVar18._8_4_ = iVar17;
      auVar18._0_8_ = uVar11;
      auVar18._12_4_ = (int)(uVar11 >> 0x20);
      auVar19 = (auVar18 | auVar6) ^ auVar4;
      iVar16 = auVar15._4_4_;
      if ((bool)(~(auVar19._4_4_ == iVar16 && auVar15._0_4_ < auVar19._0_4_ ||
                  iVar16 < auVar19._4_4_) & 1)) {
        piVar9[uVar11] = iVar17;
      }
      if ((auVar19._12_4_ != auVar15._12_4_ || auVar19._8_4_ <= auVar15._8_4_) &&
          auVar19._12_4_ <= auVar15._12_4_) {
        piVar9[uVar11 + 1] = iVar17 + 1;
      }
      auVar19 = (auVar18 | auVar5) ^ auVar4;
      iVar20 = auVar19._4_4_;
      if (iVar20 <= iVar16 && (iVar20 != iVar16 || auVar19._0_4_ <= auVar15._0_4_)) {
        piVar9[uVar11 + 2] = iVar17 + 2;
        piVar9[uVar11 + 3] = iVar17 + 3;
      }
      uVar11 = uVar11 + 4;
    } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
  }
  w._M_str = Dictionary::EOS_abi_cxx11_;
  w._M_len = DAT_00157470;
  iVar7 = Dictionary::getId((this->dict_).
                            super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,w);
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar10 = (long)__last._M_current - (long)__first._M_current >> 2;
    lVar3 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    __comp._M_comp.eosid = iVar7;
    __comp._M_comp.norms = &local_48;
    __comp._M_comp._12_4_ = 0;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
              (__first,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,__comp);
    if (0x40 < (long)__last._M_current - (long)__first._M_current) {
      __last_00._M_current = __first._M_current + 0x10;
      __comp_00._M_comp.eosid = iVar7;
      __comp_00._M_comp.norms = &local_48;
      __comp_00._M_comp._12_4_ = 0;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
                (__first,__last_00,__comp_00);
LAB_00130fec:
      if (__last_00._M_current != __last._M_current) {
        iVar16 = *__last_00._M_current;
        piVar12 = __last_00._M_current;
        do {
          iVar17 = piVar12[-1];
          if (iVar17 == iVar7 || iVar16 == iVar7) {
            if ((iVar16 != iVar7) || (iVar17 == iVar7)) goto LAB_00131039;
          }
          else if (local_48.data_.mem_[iVar16] < local_48.data_.mem_[iVar17] ||
                   local_48.data_.mem_[iVar16] == local_48.data_.mem_[iVar17]) goto LAB_00131039;
          *piVar12 = iVar17;
          piVar12 = piVar12 + -1;
        } while( true );
      }
      goto LAB_00131054;
    }
    __comp_01._M_comp.eosid = iVar7;
    __comp_01._M_comp.norms = &local_48;
    __comp_01._M_comp._12_4_ = 0;
    std::
    __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
              (__first,__last,__comp_01);
  }
LAB_00131054:
  piVar9 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start + cutoff;
  if (piVar9 != (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar9;
  }
  free(local_48.data_.mem_);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return __return_storage_ptr__;
LAB_00131039:
  *piVar12 = iVar16;
  __last_00._M_current = __last_00._M_current + 1;
  goto LAB_00130fec;
}

Assistant:

std::vector<int32_t> FastText::selectEmbeddings(int32_t cutoff) const {
  std::shared_ptr<DenseMatrix> input =
      std::dynamic_pointer_cast<DenseMatrix>(input_);
  Vector norms(input->size(0));
  input->l2NormRow(norms);
  std::vector<int32_t> idx(input->size(0), 0);
  std::iota(idx.begin(), idx.end(), 0);
  auto eosid = dict_->getId(Dictionary::EOS);
  std::sort(idx.begin(), idx.end(), [&norms, eosid](size_t i1, size_t i2) {
    if (i1 == eosid && i2 == eosid) { // satisfy strict weak ordering
      return false;
    }
    return eosid == i1 || (eosid != i2 && norms[i1] > norms[i2]);
  });
  idx.erase(idx.begin() + cutoff, idx.end());
  return idx;
}